

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct>::
DeserializeUniValue(JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct> *this,
                   UniValue *value)

{
  bool bVar1;
  reference this_00;
  UniValue *in_RSI;
  DecodePsbtInput *in_RDI;
  DecodePsbtInput local_value;
  UniValue *element;
  const_iterator __end3;
  const_iterator __begin3;
  vector<UniValue,_std::allocator<UniValue>_> *__range3;
  value_type *in_stack_fffffffffffffb58;
  vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>
  *in_stack_fffffffffffffb60;
  DecodePsbtInput *in_stack_fffffffffffffbd0;
  UniValue *in_stack_fffffffffffffc68;
  JsonClassBase<cfd::api::json::DecodePsbtInput> *in_stack_fffffffffffffc70;
  __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_> local_28;
  __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_> local_20;
  vector<UniValue,_std::allocator<UniValue>_> *local_18;
  UniValue *local_10;
  
  local_10 = in_RSI;
  bVar1 = UniValue::isArray(in_RSI);
  if (bVar1) {
    ::std::vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>
    ::clear((vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>
             *)0x662c28);
    local_18 = UniValue::getValues(local_10);
    local_20._M_current =
         (UniValue *)::std::vector<UniValue,_std::allocator<UniValue>_>::begin(local_18);
    local_28._M_current =
         (UniValue *)::std::vector<UniValue,_std::allocator<UniValue>_>::end(local_18);
    while (bVar1 = __gnu_cxx::operator!=(&local_20,&local_28), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                ::operator*(&local_20);
      bVar1 = UniValue::isObject(this_00);
      if (bVar1) {
        cfd::api::json::DecodePsbtInput::DecodePsbtInput(in_stack_fffffffffffffbd0);
        JsonClassBase<cfd::api::json::DecodePsbtInput>::DeserializeUniValue
                  (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        ::std::
        vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>::
        push_back(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
        cfd::api::json::DecodePsbtInput::~DecodePsbtInput(in_RDI);
      }
      __gnu_cxx::
      __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
      operator++(&local_20);
    }
  }
  return;
}

Assistant:

virtual void DeserializeUniValue(const UniValue& value) {
    if (!value.isArray()) {
      return;
    }
    std::vector<TYPE>::clear();
    for (const auto& element : value.getValues()) {
      if (element.isObject()) {
        TYPE local_value;
        local_value.DeserializeUniValue(element);
        std::vector<TYPE>::push_back(local_value);
      }
    }
  }